

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O2

bool test5(void)

{
  ostream *poVar1;
  Stack s2;
  Stack s3;
  _Vector_base<int,_std::allocator<int>_> local_58;
  _Vector_base<int,_std::allocator<int>_> local_40;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      (int)local_40._M_impl.super__Vector_impl_data._M_start < 1000;
      local_40._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (int)local_40._M_impl.super__Vector_impl_data._M_start + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_58,(value_type_conflict *)&local_40);
  }
  local_58._M_impl.super__Vector_impl_data._M_finish =
       local_58._M_impl.super__Vector_impl_data._M_finish + -500;
  CP::stack<int>::stack((stack<int> *)&local_40,(stack<int> *)&local_58);
  for (; local_58._M_impl.super__Vector_impl_data._M_finish !=
         local_58._M_impl.super__Vector_impl_data._M_start;
      local_58._M_impl.super__Vector_impl_data._M_finish =
           local_58._M_impl.super__Vector_impl_data._M_finish + -1) {
  }
  CP::stack<int>::stack((stack<int> *)&local_28,(stack<int> *)&local_58);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,local_40._M_impl.super__Vector_impl_data._M_finish[-1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return true;
}

Assistant:

bool test5() {
  int n = 1000;
  Stack s1;
  for (int i = 0;i < n;i++) { s1.push(i); }
  for (int i = 0;i < n/2;i++) { s1.pop(); }
  Stack s2 = s1;
  while (!s1.empty()) { s1.pop(); }
  Stack s3(s1);

  cout << s1.size() << " " << s1.empty() << endl;
  cout << s2.size() << " " << s2.empty() << s2.top() << endl;
  cout << s3.size() << " " << s3.empty() << endl;
  return true;
}